

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void expect_eq<std::__cxx11::u8string,char8_t_const*>
               (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *in_left,
               char8_t *in_right)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  long *local_30;
  AssertHelper local_28 [8];
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  char8_t *local_10;
  
  local_10 = in_right;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t_const*>
            (local_20,"in_left","in_right",in_left,&local_10);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x35,pcVar1);
    testing::internal::AssertHelper::operator=(local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_28);
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  return;
}

Assistant:

void expect_eq(LeftT in_left, RightT in_right) {
	EXPECT_EQ(in_left, in_right);
}